

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2pointutil.cc
# Opt level: O1

S2Point * S2::FromFrame(Matrix3x3_d *m,S2Point *q)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  S2Point *in_RDI;
  
  dVar1 = q->c_[0];
  dVar2 = q->c_[1];
  dVar3 = q->c_[2];
  dVar4 = m->m_[1][0];
  dVar5 = m->m_[1][1];
  dVar6 = m->m_[1][2];
  dVar7 = m->m_[2][0];
  dVar8 = m->m_[2][1];
  dVar9 = m->m_[2][2];
  in_RDI->c_[0] = m->m_[0][2] * dVar3 + m->m_[0][1] * dVar2 + m->m_[0][0] * dVar1;
  in_RDI->c_[1] = dVar6 * dVar3 + dVar5 * dVar2 + dVar4 * dVar1;
  in_RDI->c_[2] = dVar3 * dVar9 + dVar2 * dVar8 + dVar1 * dVar7;
  return in_RDI;
}

Assistant:

S2Point FromFrame(const Matrix3x3_d& m, const S2Point& q) {
  return m * q;
}